

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::get_argument_address_space_abi_cxx11_
          (CompilerMSL *this,SPIRVariable *argument)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRType *in_RDX;
  allocator local_29;
  SPIRType *local_28;
  SPIRType *type;
  SPIRVariable *argument_local;
  CompilerMSL *this_local;
  
  type = in_RDX;
  argument_local = argument;
  this_local = this;
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(in_RDX->super_IVariant).field_0xc);
  local_28 = Compiler::get<spirv_cross::SPIRType>((Compiler *)argument,uVar3);
  bVar2 = Compiler::is_physical_pointer((Compiler *)argument,local_28);
  pSVar1 = local_28;
  if (bVar2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_29);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    get_type_address_space_abi_cxx11_(this,(SPIRType *)argument,(uint32_t)pSVar1,SUB41(uVar3,0));
  }
  return this;
}

Assistant:

string CompilerMSL::get_argument_address_space(const SPIRVariable &argument)
{
	const auto &type = get<SPIRType>(argument.basetype);
	// BDA is always passed around by value. There is no storage class for the argument itself.
	if (is_physical_pointer(type))
		return "";
	return get_type_address_space(type, argument.self, true);
}